

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  uint32_t uVar2;
  vw *pvVar3;
  byte bVar4;
  bool bVar5;
  uint32_t uVar6;
  pointer poVar7;
  ostream *poVar8;
  undefined8 uVar9;
  polyprediction *ppVar10;
  uint *puVar11;
  ulong uVar12;
  vw *in_RSI;
  long *in_RDI;
  float fVar13;
  string loss_function_type;
  single_learner *base;
  learner<oaa,_example> *l;
  oaa *data_ptr;
  uint32_t tmp;
  size_t j;
  size_t i_1;
  size_t i;
  stringstream __msg;
  option_group_definition new_options;
  bool scores;
  bool probabilities;
  free_ptr<oaa> data;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  vw *in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7a8;
  _func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *predict;
  single_learner *in_stack_fffffffffffff7b0;
  single_learner *learn;
  parser *in_stack_fffffffffffff7b8;
  learner<oaa,_example> *in_stack_fffffffffffff7c0;
  int plineNumber;
  char *in_stack_fffffffffffff7c8;
  prediction_type_t pred_type;
  vw_exception *in_stack_fffffffffffff7d0;
  typed_option<bool> *in_stack_fffffffffffff7e8;
  option_group_definition *in_stack_fffffffffffff7f0;
  float local_7a8;
  allocator *l_00;
  allocator *nmemb;
  string local_690 [32];
  single_learner *local_670;
  learner<oaa,_example> *local_668;
  pointer local_660;
  uint32_t local_654;
  long local_650;
  ulong local_648;
  ulong local_640;
  undefined1 local_631;
  stringstream local_610 [16];
  ostream local_600;
  undefined4 local_488;
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [199];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<unsigned_long> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<oaa>();
  local_29 = 0;
  local_2a = 0;
  nmemb = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"One Against All Options",nmemb);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  l_00 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"oaa",l_00);
  std::unique_ptr<oaa,_void_(*)(void_*)>::operator->((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bb468);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff7a8,(unsigned_long *)in_stack_fffffffffffff7a0);
  VW::config::typed_option<unsigned_long>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"One-against-all multiclass with <k> labels",&local_189);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff7f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"oaa_subsample",&local_251);
  std::unique_ptr<oaa,_void_(*)(void_*)>::operator->((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bb54f);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff7a8,(unsigned_long *)in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"subsample this number of negative examples when learning",&local_279);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff7f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"probabilities",&local_341);
  VW::config::make_option<bool>(in_stack_fffffffffffff7a8,(bool *)in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"predict probabilites of all classes",&local_369);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"scores",&local_431);
  VW::config::make_option<bool>(in_stack_fffffffffffff7a8,(bool *)in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"output raw scores per class",&local_459);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff7a0,
             (string *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff7a0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"oaa",&local_481);
  bVar4 = (**(code **)(*local_10 + 8))(local_10,local_480);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    learn = in_stack_fffffffffffff7b0;
    if (local_18->sd->ldict != (namedlabels *)0x0) {
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbca7);
      uVar1 = poVar7->k;
      uVar6 = namedlabels::getK(local_18->sd->ldict);
      learn = in_stack_fffffffffffff7b0;
      if (uVar1 != uVar6) {
        std::__cxx11::stringstream::stringstream(local_610);
        plineNumber = (int)((ulong)in_stack_fffffffffffff7c0 >> 0x20);
        poVar8 = std::operator<<(&local_600,"error: you have ");
        uVar6 = namedlabels::getK(local_18->sd->ldict);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
        std::operator<<(poVar8," named labels; use that as the argument to oaa");
        local_631 = 1;
        uVar9 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,plineNumber,
                   (string *)in_stack_fffffffffffff7b8);
        local_631 = 0;
        __cxa_throw(uVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    pvVar3 = local_18;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbe82);
    poVar7->all = pvVar3;
    std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
              ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbe9b);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbeba);
    poVar7->pred = ppVar10;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbed3);
    poVar7->subsample_order = (uint32_t *)0x0;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbee8);
    poVar7->subsample_id = 0;
    poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                       ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbefd);
    pred_type = (prediction_type_t)in_stack_fffffffffffff7d0;
    if (poVar7->num_subsample != 0) {
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbf15);
      uVar12 = poVar7->num_subsample;
      poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                         ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbf2e);
      pred_type = (prediction_type_t)in_stack_fffffffffffff7d0;
      if (uVar12 < poVar7->k) {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbfa0);
        puVar11 = calloc_or_throw<unsigned_int>((size_t)nmemb);
        poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                           ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbfbf);
        poVar7->subsample_order = puVar11;
        for (local_640 = 0; uVar12 = local_640,
            poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                               ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbff4), uVar12 < poVar7->k;
            local_640 = local_640 + 1) {
          uVar6 = (uint32_t)local_640;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc020);
          poVar7->subsample_order[local_640] = uVar6;
        }
        local_648 = 0;
        while( true ) {
          uVar12 = local_648;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc075);
          pred_type = (prediction_type_t)in_stack_fffffffffffff7d0;
          if (poVar7->k <= uVar12) break;
          fVar13 = merand48((uint64_t *)in_stack_fffffffffffff7a0);
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc0b5);
          local_7a8 = (float)(poVar7->k - local_648);
          uVar12 = (ulong)(fVar13 * local_7a8);
          local_650 = (uVar12 | (long)(fVar13 * local_7a8 - 9.223372e+18) & (long)uVar12 >> 0x3f) +
                      local_648;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc161);
          local_654 = poVar7->subsample_order[local_648];
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc184);
          uVar6 = poVar7->subsample_order[local_650];
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc1a7);
          uVar2 = local_654;
          poVar7->subsample_order[local_648] = uVar6;
          poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                             ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc1d8);
          poVar7->subsample_order[local_650] = uVar2;
          local_648 = local_648 + 1;
        }
      }
      else {
        poVar7 = std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                           ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bbf4b);
        poVar7->num_subsample = 0;
        poVar8 = std::operator<<(&(local_18->trace_message).super_ostream,
                                 "oaa is turning off subsampling because your parameter >= K");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
    }
    local_660 = std::unique_ptr<oaa,_void_(*)(void_*)>::get
                          ((unique_ptr<oaa,_void_(*)(void_*)> *)in_stack_fffffffffffff7a0);
    setup_base((options_i *)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0);
    in_stack_fffffffffffff7b0 = LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    local_670 = in_stack_fffffffffffff7b0;
    if (((local_29 & 1) == 0) && ((local_2a & 1) == 0)) {
      if (local_18->raw_prediction < 1) {
        in_stack_fffffffffffff7b8 = local_18->p;
        predict = (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc54c);
        in_stack_fffffffffffff7c0 =
             LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                       ((free_ptr<oaa> *)in_stack_fffffffffffff7c0,
                        (learner<char,_example> *)in_stack_fffffffffffff7b8,
                        (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff7b0,predict,(parser *)in_stack_fffffffffffff7a0,
                        CONCAT44(in_stack_fffffffffffff79c,4),pred_type);
        local_668 = in_stack_fffffffffffff7c0;
      }
      else {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc4d8);
        local_668 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff7c0,
                               (learner<char,_example> *)in_stack_fffffffffffff7b8,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff7a8,(parser *)in_stack_fffffffffffff7a0,
                               CONCAT44(in_stack_fffffffffffff79c,4),
                               (prediction_type_t)in_stack_fffffffffffff7b0);
        in_stack_fffffffffffff7b0 = learn;
      }
    }
    else {
      local_18->delete_prediction = delete_scalars;
      if ((local_29 & 1) == 0) {
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc438);
        local_668 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff7c0,
                               (learner<char,_example> *)in_stack_fffffffffffff7b8,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff7a8,(parser *)in_stack_fffffffffffff7a0,
                               CONCAT44(in_stack_fffffffffffff79c,1),pred_type);
        LEARNER::learner<oaa,_example>::set_finish_example(local_668,finish_example_scores<false>);
        in_stack_fffffffffffff7b0 = learn;
      }
      else {
        (**local_18->loss->_vptr_loss_function)(local_690);
        bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff7a0,
                                (char *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798
                                                ));
        if (bVar5) {
          poVar8 = std::operator<<(&(local_18->trace_message).super_ostream,
                                   "WARNING: --probabilities should be used only with --loss_function=logistic"
                                  );
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        }
        std::unique_ptr<oaa,_void_(*)(void_*)>::operator->
                  ((unique_ptr<oaa,_void_(*)(void_*)> *)0x3bc383);
        local_668 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                              ((free_ptr<oaa> *)in_stack_fffffffffffff7c0,
                               (learner<char,_example> *)in_stack_fffffffffffff7b8,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)learn,
                               (_func_void_oaa_ptr_learner<char,_example>_ptr_example_ptr *)
                               in_stack_fffffffffffff7a8,(parser *)in_stack_fffffffffffff7a0,
                               CONCAT44(in_stack_fffffffffffff79c,1),pred_type);
        local_18->sd->report_multiclass_log_loss = true;
        LEARNER::learner<oaa,_example>::set_finish_example(local_668,finish_example_scores<true>);
        std::__cxx11::string::~string(local_690);
        in_stack_fffffffffffff7b0 = learn;
      }
    }
    if (local_660->num_subsample != 0) {
      LEARNER::learner<oaa,example>::set_learn<LEARNER::learner<char,example>>
                ((learner<oaa,example> *)local_668,learn_randomized);
      LEARNER::learner<oaa,_example>::set_finish_example
                (local_668,MULTICLASS::finish_example_without_loss<oaa>);
    }
    LEARNER::learner<oaa,_example>::set_finish
              (in_stack_fffffffffffff7c0,(_func_void_oaa_ptr *)in_stack_fffffffffffff7b8);
    in_stack_fffffffffffff7a0 = (vw *)LEARNER::make_base<oaa,example>(local_668);
    local_8 = in_stack_fffffffffffff7a0;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_488 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff7a0);
  std::unique_ptr<oaa,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<oaa,_void_(*)(void_*)> *)in_stack_fffffffffffff7b0);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0) {
    l->set_learn(learn_randomized);
    l->set_finish_example(MULTICLASS::finish_example_without_loss<oaa>);
  }
  l->set_finish(finish);

  return make_base(*l);
}